

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

bool doctest::detail::parseIntOption(int argc,char **argv,char *pattern,optionType type,int *res)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *b;
  String parsedValue;
  String local_40;
  String local_38;
  
  String::String(&local_40,"");
  String::String(&local_38,"");
  bVar1 = parseOption(argc,argv,pattern,&local_40,&local_38);
  free(local_38.m_str);
  if (bVar1) {
    if (type == option_bool) {
      b = "1";
      lVar3 = 0;
      do {
        iVar2 = stricmp(local_40.m_str,b);
        if (iVar2 == 0) {
          iVar2 = 1;
          goto LAB_0011469f;
        }
        iVar2 = stricmp(local_40.m_str,&DAT_0014a0b0 + lVar3);
        if (iVar2 == 0) {
          iVar2 = 0;
          goto LAB_0011469f;
        }
        b = b + 5;
        lVar3 = lVar3 + 6;
      } while (lVar3 != 0x18);
    }
    else {
      iVar2 = atoi(local_40.m_str);
      if (iVar2 != 0) {
LAB_0011469f:
        *res = iVar2;
        bVar1 = true;
        goto LAB_001146a8;
      }
    }
  }
  bVar1 = false;
LAB_001146a8:
  free(local_40.m_str);
  return bVar1;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(parseOption(argc, argv, pattern, parsedValue)) {
            if(type == 0) {
                // boolean
                const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
                const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

                // if the value matches any of the positive/negative possibilities
                for(unsigned i = 0; i < 4; i++) {
                    if(parsedValue.compare(positive[i], true) == 0) {
                        res = 1;
                        return true;
                    }
                    if(parsedValue.compare(negative[i], true) == 0) {
                        res = 0;
                        return true;
                    }
                }
            } else {
                // integer
                int theInt = atoi(parsedValue.c_str());
                if(theInt != 0) {
                    res = theInt;
                    return true;
                }
            }
        }
        return false;
    }